

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

Iterator __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
::search(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
         *this,Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
               *entry)

{
  bool bVar1;
  int iVar2;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
  *left;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
  **ppBVar3;
  size_t index;
  Iterator IVar4;
  
  iVar2 = b_array::first_ge<Map::Pair<std::__cxx11::string,sql_parser::Keyword>>
                    (&this->data,this->data_size,entry);
  index = (size_t)iVar2;
  IVar4.offset = index;
  IVar4.node_ptr = this;
  if (index < this->data_size) {
    left = b_array::
           Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
           ::operator[](&this->data,index);
    bVar1 = Map::operator==(left,entry);
  }
  else {
    bVar1 = false;
  }
  if (bVar1 != false) {
    if (this->subset_size == 0) {
      return IVar4;
    }
    if (bVar1 != false) {
      index = index + 1;
      goto LAB_0010b3c3;
    }
  }
  if (this->subset_size == 0) {
    return (Iterator)ZEXT816(0);
  }
LAB_0010b3c3:
  ppBVar3 = b_array::
            Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>_*>
            ::operator[](&this->subset,index);
  IVar4 = search(*ppBVar3,entry);
  return IVar4;
}

Assistant:

typename BPlusTree<T>::Iterator BPlusTree<T>::search(const T& entry) const {
    size_t index = b_array::first_ge(data, data_size, entry);
    bool found = index < data_size && data[index] == entry;
    if (found && is_leaf())
        return Iterator((BPlusTree<T>*)this, index);
    else if (found && !is_leaf())
        return subset[index + 1]->search(entry);
    else if (!found && !is_leaf())
        return subset[index]->search(entry);
    else if (!found && is_leaf())
        return Iterator(nullptr);    
    return Iterator(nullptr);
}